

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,uchar c)

{
  uchar *puVar1;
  CBStringException *this_00;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  uchar c_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_00228840;
  (this->super_tagbstring).mlen = 2;
  (this->super_tagbstring).slen = 1;
  bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf] = c;
  puVar1 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
  (this->super_tagbstring).data = puVar1;
  if (puVar1 == (uchar *)0x0) {
    (this->super_tagbstring).slen = 0;
    (this->super_tagbstring).mlen = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_60,"CBString::Failure in (char) constructor",&local_61);
    CBStringException::CBStringException((CBStringException *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_40);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  *(this->super_tagbstring).data = bstr__cppwrapper_exception.msg.field_2._M_local_buf[0xf];
  (this->super_tagbstring).data[1] = '\0';
  return;
}

Assistant:

CBString::CBString (unsigned char c) {
	mlen = 2;
	slen = 1;
	if (NULL == (data = (unsigned char *) bstr__alloc (mlen))) {
		mlen = slen = 0;
		bstringThrow ("Failure in (char) constructor");
	} else {
		data[0] = c;
		data[1] = '\0';
	}
}